

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_windows.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  _Bool _Var2;
  uint uVar3;
  mfb_update_state mVar4;
  mfb_window *window;
  mfb_window *window_00;
  uint uVar5;
  mfb_window *window_01;
  long lVar6;
  int iVar7;
  uint32_t c;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint32_t pallete [512];
  float local_858;
  uint auStack_838 [64];
  uint auStack_738 [64];
  uint auStack_638 [64];
  uint auStack_538 [64];
  uint auStack_438 [64];
  uint auStack_338 [64];
  uint auStack_238 [64];
  uint auStack_138 [66];
  
  window = mfb_open_ex("Multiple Windows Test",800,600,1);
  if (window != (mfb_window *)0x0) {
    mfb_set_active_callback(window,active);
    mfb_set_resize_callback(window,resize);
    mfb_set_keyboard_callback(window,keyboard);
    mfb_set_char_input_callback(window,char_input);
    mfb_set_mouse_button_callback(window,mouse_btn);
    mfb_set_mouse_move_callback(window,mouse_move);
    mfb_set_mouse_scroll_callback(window,mouse_scroll);
    mfb_set_user_data(window,"Window A");
    mfb_set_viewport(window,0x19,0x19,0x2ee,0x226);
    window_00 = mfb_open_ex("Secondary Window",0x140,0xf0,1);
    if (window_00 != (mfb_window *)0x0) {
      mfb_set_active_callback(window_00,active);
      mfb_set_resize_callback(window_00,resize);
      mfb_set_keyboard_callback(window_00,keyboard);
      mfb_set_char_input_callback(window_00,char_input);
      mfb_set_mouse_button_callback(window_00,mouse_btn);
      mfb_set_mouse_move_callback(window_00,mouse_move);
      mfb_set_mouse_scroll_callback(window_00,mouse_scroll);
      mfb_set_user_data(window_00,"Window B");
      lVar8 = 0;
      do {
        fVar9 = sinf(((float)(int)lVar8 * 1.40625 * 3.1415927) / 180.0);
        uVar3 = (uint)(fVar9 * 255.0 + 0.5);
        auStack_838[lVar8] = uVar3 << 0x10;
        auStack_738[lVar8] = uVar3 << 8 | 0xff0000;
        uVar5 = 0xff - uVar3;
        auStack_638[lVar8] = uVar5 * 0x10000 | 0xff00;
        auStack_538[lVar8] = uVar3 | 0xff00;
        auStack_438[lVar8] = uVar5 * 0x100 | 0xff;
        auStack_338[lVar8] = uVar3 << 0x10 | 0xff;
        auStack_238[lVar8] = uVar5 | 0xff0000;
        auStack_138[lVar8] = uVar5 * 0x10000;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      mfb_set_target_fps(10);
      uVar3 = 0xbeef;
      local_858 = 0.0;
      do {
        if (window == (mfb_window *)0x0) {
          window_01 = (mfb_window *)0x0;
        }
        else {
          lVar8 = 0;
          do {
            uVar5 = (int)uVar3 >> 3 ^ uVar3;
            uVar3 = (uVar5 & 1) << 0x1e | (int)uVar3 >> 1;
            *(uint *)((long)g_buffer_a + lVar8) = (uVar5 >> 1 & 0xff) * 0x10101;
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x1d4c00);
          mVar4 = mfb_update(window,g_buffer_a);
          window_01 = window;
          if (mVar4 != STATE_OK) {
            window_01 = (mfb_window *)0x0;
          }
        }
        if (window_00 == (mfb_window *)0x0) {
          window_00 = (mfb_window *)0x0;
        }
        else {
          fVar9 = (local_858 * 3.1415927) / 180.0;
          fVar10 = sinf(fVar9);
          fVar9 = cosf(fVar9);
          iVar7 = 0;
          lVar8 = 0;
          do {
            fVar11 = cosf(((float)iVar7 * fVar9 * 3.1415927) / 180.0);
            lVar6 = 0;
            do {
              fVar12 = sinf(((float)(int)lVar6 * fVar10 * 3.1415927) / 180.0);
              g_buffer_b[lVar6 + (int)lVar8] =
                   auStack_838[(int)((fVar12 + 2.0 + fVar11) * 0.25 * 511.0)];
              lVar6 = lVar6 + 1;
            } while ((int)lVar6 != 0x140);
            iVar7 = iVar7 + 1;
            lVar8 = (int)lVar8 + lVar6;
          } while (iVar7 != 0xf0);
          local_858 = local_858 + 0.1;
          mVar4 = mfb_update(window_00,g_buffer_b);
          if (mVar4 != STATE_OK) {
            window_00 = (mfb_window *)0x0;
          }
        }
        bVar1 = window_00 == (mfb_window *)0x0;
        if (window_01 == (mfb_window *)0x0 && bVar1) {
LAB_00102a81:
          window_00 = (mfb_window *)0x0;
LAB_00102a84:
          window = (mfb_window *)0x0;
        }
        else {
          if (window_01 == (mfb_window *)0x0) {
            if (window_00 == (mfb_window *)0x0) goto LAB_00102a81;
            _Var2 = mfb_wait_sync(window_00);
            if (!_Var2) {
              window_00 = (mfb_window *)0x0;
            }
            goto LAB_00102a84;
          }
          _Var2 = mfb_wait_sync(window_01);
          window = window_01;
          if (!_Var2) {
            window = (mfb_window *)0x0;
          }
        }
      } while (window_01 != (mfb_window *)0x0 || !bVar1);
    }
  }
  return 0;
}

Assistant:

int 
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window_a = mfb_open_ex("Multiple Windows Test", WIDTH_A, HEIGHT_A, WF_RESIZABLE);
    if (!window_a)
        return 0;

    mfb_set_active_callback(window_a, active);
    mfb_set_resize_callback(window_a, resize);
    mfb_set_keyboard_callback(window_a, keyboard);
    mfb_set_char_input_callback(window_a, char_input);
    mfb_set_mouse_button_callback(window_a, mouse_btn);
    mfb_set_mouse_move_callback(window_a, mouse_move);
    mfb_set_mouse_scroll_callback(window_a, mouse_scroll);

    mfb_set_user_data(window_a, (void *) "Window A");
    mfb_set_viewport(window_a, 25, 25, WIDTH_A-50, HEIGHT_A-50);

    //--
    struct mfb_window *window_b = mfb_open_ex("Secondary Window", WIDTH_B, HEIGHT_B, WF_RESIZABLE);
    if (!window_b)
        return 0;

    mfb_set_active_callback(window_b, active);
    mfb_set_resize_callback(window_b, resize);
    mfb_set_keyboard_callback(window_b, keyboard);
    mfb_set_char_input_callback(window_b, char_input);
    mfb_set_mouse_button_callback(window_b, mouse_btn);
    mfb_set_mouse_move_callback(window_b, mouse_move);
    mfb_set_mouse_scroll_callback(window_b, mouse_scroll);

    mfb_set_user_data(window_b, (void *) "Window B");

    // Generate pallete for plasma effect
    uint32_t    pallete[512];
    float       inc = 90.0f / 64.0f;
    for(uint32_t c=0; c<64; ++c) {
        int32_t col = (int32_t) ((255.0f * sinf(c * inc * kPI / 180.0f)) + 0.5f);
        pallete[64*0 + c] = MFB_RGB(col,     0,       0);
        pallete[64*1 + c] = MFB_RGB(255,     col,     0);
        pallete[64*2 + c] = MFB_RGB(255-col, 255,     0);
        pallete[64*3 + c] = MFB_RGB(0,       255,     col);
        pallete[64*4 + c] = MFB_RGB(0,       255-col, 255);
        pallete[64*5 + c] = MFB_RGB(col,     0,       255);
        pallete[64*6 + c] = MFB_RGB(255,     0,       255-col);
        pallete[64*7 + c] = MFB_RGB(255-col, 0,       0);
    }

    mfb_set_target_fps(10);

    //--
    float   time = 0;
    for (;;)
    {
        int      i, x, y;
        float    dx, dy, time_x, time_y;
        int      index;
        
        mfb_update_state state_a, state_b;

        if(window_a != 0x0) {
            for (i = 0; i < WIDTH_A * HEIGHT_A; ++i)
            {
                noise = seed;
                noise >>= 3;
                noise ^= seed;
                carry = noise & 1;
                noise >>= 1;
                seed >>= 1;
                seed |= (carry << 30);
                noise &= 0xFF;
                g_buffer_a[i] = MFB_RGB(noise, noise, noise); 
            }

            //--
            state_a = mfb_update(window_a, g_buffer_a);
            if (state_a != STATE_OK) {
                window_a = 0x0;
            }
        }

        //--
        if(window_b != 0x0) {
            time_x = sinf(time * kPI / 180.0f);
            time_y = cosf(time * kPI / 180.0f);
            i = 0;
            for(y=0; y<HEIGHT_B; ++y) {
                dy = cosf((y * time_y) * kPI / 180.0f);                // [-1, 1]
                for(x=0; x<WIDTH_B; ++x) {
                    dx = sinf((x * time_x) * kPI / 180.0f);            // [-1, 1]

                    index = (int) ((2.0f + dx + dy) * 0.25f * 511.0f);  // [0, 511]
                    g_buffer_b[i++] = pallete[index];
                }
            }
            time += 0.1f;

            //--
            state_b = mfb_update(window_b, g_buffer_b);
            if (state_b != STATE_OK) {
                window_b = 0x0;
            }
        }

        if(window_a == 0x0 && window_b == 0x0) {
            break;
        }

        // Don't need to do this for both windows in the same thread
        if(window_a != 0x0) {
            if(mfb_wait_sync(window_a) == false) {
                window_a = 0x0;
            }
        }
        else if(window_b != 0x0) {
            if(mfb_wait_sync(window_b) == false) {
                window_b = 0x0;
            }
        }
    }

    return 0;
}